

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void makeTokenMap(UDataSwapper *ds,int16_t *tokens,uint16_t tokenCount,uint8_t *map,
                 UErrorCode *pErrorCode)

{
  uint8_t *puVar1;
  uint16_t uVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  undefined6 in_register_00000012;
  uint uVar7;
  ulong uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t c1;
  uint8_t c2;
  UBool usedOutChar [256];
  byte local_13e;
  byte local_13d;
  undefined4 local_13c;
  char local_138 [264];
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if (ds->inCharset == ds->outCharset) {
    uVar9 = '\0';
    uVar10 = '\x01';
    uVar11 = '\x02';
    uVar12 = '\x03';
    uVar13 = '\x04';
    uVar14 = '\x05';
    uVar15 = '\x06';
    uVar16 = '\a';
    uVar17 = '\b';
    uVar18 = '\t';
    uVar19 = '\n';
    uVar20 = '\v';
    uVar21 = '\f';
    uVar22 = '\r';
    uVar23 = '\x0e';
    uVar24 = '\x0f';
    lVar4 = 0;
    do {
      puVar1 = map + lVar4;
      *puVar1 = uVar9;
      puVar1[1] = uVar10;
      puVar1[2] = uVar11;
      puVar1[3] = uVar12;
      puVar1[4] = uVar13;
      puVar1[5] = uVar14;
      puVar1[6] = uVar15;
      puVar1[7] = uVar16;
      puVar1[8] = uVar17;
      puVar1[9] = uVar18;
      puVar1[10] = uVar19;
      puVar1[0xb] = uVar20;
      puVar1[0xc] = uVar21;
      puVar1[0xd] = uVar22;
      puVar1[0xe] = uVar23;
      puVar1[0xf] = uVar24;
      lVar4 = lVar4 + 0x10;
      uVar9 = uVar9 + '\x10';
      uVar10 = uVar10 + '\x10';
      uVar11 = uVar11 + '\x10';
      uVar12 = uVar12 + '\x10';
      uVar13 = uVar13 + '\x10';
      uVar14 = uVar14 + '\x10';
      uVar15 = uVar15 + '\x10';
      uVar16 = uVar16 + '\x10';
      uVar17 = uVar17 + '\x10';
      uVar18 = uVar18 + '\x10';
      uVar19 = uVar19 + '\x10';
      uVar20 = uVar20 + '\x10';
      uVar21 = uVar21 + '\x10';
      uVar22 = uVar22 + '\x10';
      uVar23 = uVar23 + '\x10';
      uVar24 = uVar24 + '\x10';
    } while (lVar4 != 0x100);
  }
  else {
    memset(map,0,0x100);
    memset(local_138,0,0x100);
    local_13c = (undefined4)CONCAT62(in_register_00000012,tokenCount);
    uVar2 = tokenCount;
    if (0xff < tokenCount) {
      uVar2 = 0x100;
    }
    if (1 < tokenCount) {
      uVar8 = 1;
      do {
        if (tokens[uVar8] == -1) {
          local_13e = (byte)uVar8;
          (*ds->swapInvChars)(ds,&local_13e,1,&local_13d,pErrorCode);
          if (U_ZERO_ERROR < *pErrorCode) {
            udata_printError_63(ds,
                                "unames/makeTokenMap() finds variant character 0x%02x used (input charset family %d)\n"
                                ,uVar8 & 0xffffffff,(ulong)ds->inCharset);
            return;
          }
          map[local_13e] = local_13d;
          local_138[local_13d] = '\x01';
        }
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
      if (1 < (ushort)local_13c) {
        uVar3 = 1;
        uVar8 = 1;
        do {
          if (map[uVar8] == '\0') {
            uVar6 = uVar3 - 1;
            do {
              uVar7 = uVar3 & 0xffff;
              uVar3 = uVar3 + 1;
              bVar5 = (char)uVar6 + 1;
              uVar6 = (uint)bVar5;
            } while (local_138[uVar7] != '\0');
            map[uVar8] = bVar5;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar2);
      }
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }